

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void ptrmapPutOvflPtr(MemPage *pPage,u8 *pCell,int *pRC)

{
  u32 key;
  undefined1 local_40 [4];
  Pgno ovfl;
  CellInfo info;
  int *pRC_local;
  u8 *pCell_local;
  MemPage *pPage_local;
  
  if ((*pRC == 0) &&
     (info._24_8_ = pRC, btreeParseCellPtr(pPage,pCell,(CellInfo *)local_40),
     (ushort)info.nPayload != 0)) {
    key = sqlite3Get4byte(pCell + (ushort)info.nPayload);
    ptrmapPut(pPage->pBt,key,'\x03',pPage->pgno,(int *)info._24_8_);
  }
  return;
}

Assistant:

static void ptrmapPutOvflPtr(MemPage *pPage, u8 *pCell, int *pRC){
  CellInfo info;
  if( *pRC ) return;
  assert( pCell!=0 );
  btreeParseCellPtr(pPage, pCell, &info);
  assert( (info.nData+(pPage->intKey?0:info.nKey))==info.nPayload );
  if( info.iOverflow ){
    Pgno ovfl = get4byte(&pCell[info.iOverflow]);
    ptrmapPut(pPage->pBt, ovfl, PTRMAP_OVERFLOW1, pPage->pgno, pRC);
  }
}